

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-log.c
# Opt level: O0

void borg_prt_binary(uint32_t flags,wchar_t row,wchar_t col)

{
  undefined4 local_1c;
  undefined4 local_18;
  uint32_t bitmask;
  wchar_t i;
  wchar_t col_local;
  wchar_t row_local;
  uint32_t flags_local;
  
  local_1c = 1;
  bitmask = col;
  for (local_18 = 1; local_18 < 0x21; local_18 = local_18 + 1) {
    if ((flags & local_1c) == 0) {
      Term_putch(bitmask,row,L'\x01',L'-');
    }
    else {
      Term_putch(bitmask,row,L'\x06',L'*');
    }
    bitmask = bitmask + 1;
    local_1c = local_1c << 1;
  }
  return;
}

Assistant:

static void borg_prt_binary(uint32_t flags, int row, int col)
{
    int      i;
    uint32_t bitmask;

    /* Scan the flags */
    for (i = bitmask = 1; i <= 32; i++, bitmask *= 2) {
        /* Dump set bits */
        if (flags & bitmask) {
            Term_putch(col++, row, COLOUR_BLUE, '*');
        }

        /* Dump unset bits */
        else {
            Term_putch(col++, row, COLOUR_WHITE, '-');
        }
    }
}